

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O3

int __thiscall Epoll::modify_event(Epoll *this,int fd,int state)

{
  int iVar1;
  int iVar2;
  epoll_event ev;
  uint32_t local_14;
  int local_10;
  
  local_14 = state;
  local_10 = fd;
  iVar1 = epoll_ctl(this->_epfd,3,fd,(epoll_event *)&local_14);
  iVar2 = 0;
  if (iVar1 < 0) {
    modify_event((Epoll *)(ulong)(uint)fd);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Epoll::modify_event(const int fd, const int state)
{
    struct epoll_event ev;
    ev.events = state;
    ev.data.fd = fd;
    int ret = epoll_ctl(_epfd, EPOLL_CTL_MOD, fd, &ev);
    if (ret < 0)
    {
        LOG_PRINT("epoll_ctl modify fd:%d failed! error: %s", fd, strerror(errno));
        // exit(EXIT_FAILURE);
        return -1;
    }

    return 0;
}